

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

void __thiscall CppGenerator::aggregateGenerator(CppGenerator *this,size_t group_id,TDNode *node)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  pointer pcVar2;
  pointer pvVar3;
  Aggregate *pAVar4;
  pointer puVar5;
  size_t *psVar6;
  vector<DependentComputation,_std::allocator<DependentComputation>_> *this_00;
  size_t sVar7;
  View *pVVar8;
  View *pVVar9;
  ostream *poVar10;
  pointer ppAVar11;
  size_t incCounter;
  ulong uVar12;
  ulong uVar13;
  size_t aggNo;
  vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
  *pvVar14;
  ulong uVar15;
  size_t *incViewID;
  size_t *psVar16;
  allocator_type local_129;
  vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
  *local_128;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_120;
  TDNode *local_118;
  vector<DependentComputation,_std::allocator<DependentComputation>_> *local_110;
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  *local_108;
  vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  *local_100;
  vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
  *local_f8;
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  *local_f0;
  vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
  *local_e8;
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  *local_e0;
  vector<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
  *local_d8;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *local_d0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_c0;
  pointer local_b8;
  size_t local_b0;
  value_type local_a8;
  dyn_bitset loopFactors;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  localAggReg;
  Aggregate aggregate;
  
  pvVar1 = this->groupVariableOrder;
  pcVar2 = (this->aggregateHeader)._M_dataplus._M_p;
  local_c0 = pvVar1 + group_id;
  local_b8 = (this->groupVariableOrderBitset).
             super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
             super__Vector_impl_data._M_start + group_id;
  (this->aggregateHeader)._M_string_length = 0;
  *pcVar2 = '\0';
  local_118 = node;
  local_b0 = group_id;
  computeViewLevel(this,group_id,node);
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::clear(&this->localProductList);
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::clear(&this->localProductMap);
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::clear(&this->contributingViewList);
  local_108 = &this->viewProductList;
  std::
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ::clear(local_108);
  local_100 = &this->viewProductMap;
  std::
  vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  ::clear(local_100);
  local_f0 = &this->newAggregateRegister;
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::clear(local_f0);
  local_e0 = &this->aggregateRegisterMap;
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::clear(local_e0);
  local_128 = &this->productToVariableMap;
  std::
  vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
  ::clear(local_128);
  std::
  vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
  ::clear(&this->productToVariableRegister);
  local_f8 = &this->postRegisterList;
  std::
  vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
  ::clear(local_f8);
  local_e8 = &this->postRegisterMap;
  std::
  vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
  ::clear(local_e8);
  local_d8 = &this->totalLoopFactors;
  std::
  vector<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
  ::clear(local_d8);
  local_d0 = &this->totalLoopFactorList;
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::clear(local_d0);
  local_c8 = &this->productLoopID;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(local_c8);
  local_120 = &this->incViewLoopID;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(local_120);
  local_110 = (vector<DependentComputation,_std::allocator<DependentComputation>_> *)
              &this->aggregateComputation;
  std::
  vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
  ::clear((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
           *)local_110);
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::resize(&this->localProductList,
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::resize(&this->localProductMap,
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::resize(&this->contributingViewList,
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ::resize(local_108,
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  ::resize(local_100,
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::resize(local_f0,(long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3);
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::resize(local_e0,(long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3);
  std::
  vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
  ::resize(local_f8,(long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3);
  std::
  vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
  ::resize(local_e8,(long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3);
  std::
  vector<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
  ::resize(local_d8,(long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::resize(local_d0,(long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(local_c8,(long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)pvVar1[group_id].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(local_120,
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->aggRegLoopID,
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->aggregateRemapping,
           ((long)(this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->newAggregateRegister).
                 super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->localProductRemapping,
           ((long)(this->localProductList).
                  super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->localProductList).
                 super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->viewProductRemapping,
           ((long)(this->viewProductList).
                  super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->viewProductList).
                 super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(&this->postRemapping);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->postRemapping,
           ((long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  std::
  vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
  ::resize(local_128,
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
  ::resize(&this->productToVariableRegister,
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2);
  sVar7 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  std::
  vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
  ::resize((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
            *)local_110,sVar7);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::resize(&this->newAggregateRemapping,
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)pvVar1[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3);
  pvVar3 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar14 = *(vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
              **)&pvVar3[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data;
  local_120 = *(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                **)((long)&pvVar3[group_id].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data + 8);
  local_110 = &this->dependentComputation;
  while( true ) {
    if (pvVar14 ==
        (vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
         *)local_120) {
      return;
    }
    pVVar8 = QueryCompiler::getView
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(size_t)(pvVar14->
                                       super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start);
    pAVar4 = *(pVVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (local_118->_numOfNeighbors - (ulong)(pVVar8->_origin != pVVar8->_destination) !=
        (ulong)((long)*(pointer *)
                       ((long)&(pAVar4->_incoming).
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               ._M_impl + 8) -
                *(long *)&(pAVar4->_incoming).
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data >> 4) /
        (ulong)(((long)*(pointer *)
                        ((long)&(pAVar4->_agg).
                                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                ._M_impl + 8) -
                *(long *)&(pAVar4->_agg).
                          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                          ._M_impl) / 0xc0)) break;
    sVar7 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              (&loopFactors,sVar7 + 1,0,(allocator<unsigned_long> *)&aggregate);
    local_128 = pvVar14;
    for (uVar12 = 0; pvVar14 = local_128, uVar12 != 100; uVar12 = uVar12 + 1) {
      uVar15 = uVar12 >> 6;
      uVar13 = 1L << ((byte)uVar12 & 0x3f);
      if ((((pVVar8->_fVars).super__Base_bitset<2UL>._M_w[uVar15] >> (uVar12 & 0x3f) & 1) != 0) &&
         (((local_b8->super__Base_bitset<2UL>)._M_w[uVar15] & uVar13) == 0)) {
        if (((local_118->_bag).super__Base_bitset<2UL>._M_w[uVar15] & uVar13) == 0) {
          puVar5 = (local_128->
                   super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          psVar6 = this->incomingViews[(long)puVar5].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (psVar16 = this->incomingViews[(long)puVar5].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start; psVar16 != psVar6; psVar16 = psVar16 + 1)
          {
            pVVar9 = QueryCompiler::getView
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                ,*psVar16);
            if (((pVVar9->_fVars).super__Base_bitset<2UL>._M_w[uVar15] & uVar13) != 0) {
              loopFactors.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[*psVar16 >> 6] =
                   loopFactors.m_bits.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[*psVar16 >> 6] | 1L << ((byte)*psVar16 & 0x3f);
            }
          }
        }
        else {
          sVar7 = QueryCompiler::numberOfViews
                            ((this->_qc).
                             super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          loopFactors.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[sVar7 >> 6] =
               loopFactors.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[sVar7 >> 6] | 1L << ((byte)sVar7 & 0x3f);
        }
      }
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((this->outViewLoop).
               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               (long)(local_128->
                     super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,&loopFactors);
    pvVar1 = local_c0;
    uVar12 = 0;
    while( true ) {
      ppAVar11 = (pVVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pVVar8->_aggregates).
                        super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppAVar11 >> 3) <= uVar12) break;
      Aggregate::Aggregate(&aggregate,ppAVar11[uVar12]);
      local_a8.first =
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
      local_a8.second = 0;
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::vector(&localAggReg,
               ((long)aggregate._agg.
                      super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)aggregate._agg.
                     super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0xc0,&local_a8,&local_129);
      this_00 = local_110;
      std::vector<DependentComputation,_std::allocator<DependentComputation>_>::clear(local_110);
      std::vector<DependentComputation,_std::allocator<DependentComputation>_>::resize
                (this_00,((long)aggregate._agg.
                                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)aggregate._agg.
                               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0xc0);
      registerAggregatesToVariables
                (this,&aggregate,local_b0,
                 (size_t)(pvVar14->
                         super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,uVar12,0,
                 (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)&localAggReg.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                );
      std::
      _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~_Vector_base(&localAggReg.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     );
      Aggregate::~Aggregate(&aggregate);
      uVar12 = uVar12 + 1;
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&loopFactors);
    pvVar14 = (vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
               *)&(pvVar14->
                  super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
  }
  std::operator<<((ostream *)&std::cerr,"Why is this?! \n ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  poVar10 = std::operator<<(poVar10," ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  poVar10 = std::operator<<(poVar10," ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  poVar10 = std::operator<<(poVar10," ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  poVar10 = std::operator<<(poVar10,"  ");
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::operator<<(poVar10,"\n");
  for (uVar12 = 0;
      ppAVar11 = (pVVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(pVVar8->_aggregates).
                             super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)ppAVar11 >> 3);
      uVar12 = uVar12 + 1) {
    for (uVar13 = 0;
        uVar13 < (ulong)((long)*(pointer *)
                                ((long)&(ppAVar11[uVar12]->_incoming).
                                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                        ._M_impl + 8) -
                         *(long *)&(ppAVar11[uVar12]->_incoming).
                                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data >> 4); uVar13 = uVar13 + 1) {
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar10 = std::operator<<(poVar10," ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::operator<<(poVar10," - ");
      ppAVar11 = (pVVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  exit(1);
}

Assistant:

void CppGenerator::aggregateGenerator(size_t group_id, const TDNode& node)
{
    const std::vector<size_t>& varOrder = groupVariableOrder[group_id];
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];
    
    aggregateHeader.clear();

    // Compute the level of the views in this group 
    computeViewLevel(group_id,node);
    
    // TODO: TODO: TODO: Make sure the below is necessary 
    localProductList.clear();
    localProductMap.clear();
    contributingViewList.clear();
    
    viewProductList.clear();
    viewProductMap.clear();

    newAggregateRegister.clear();
    aggregateRegisterMap.clear();
    
    productToVariableMap.clear();
    productToVariableRegister.clear();

    postRegisterList.clear();
    postRegisterMap.clear();

    totalLoopFactors.clear();
    totalLoopFactorList.clear();
    
    productLoopID.clear();
    incViewLoopID.clear();

    aggregateComputation.clear();
    
    localProductList.resize(varOrder.size() * 2);
    localProductMap.resize(varOrder.size()* 2);
    contributingViewList.resize(varOrder.size() * 2);
    
    viewProductList.resize(varOrder.size() * 2);
    viewProductMap.resize(varOrder.size() * 2);

    newAggregateRegister.resize(varOrder.size());
    aggregateRegisterMap.resize(varOrder.size());

    postRegisterList.resize(varOrder.size());
    postRegisterMap.resize(varOrder.size());

    totalLoopFactors.resize(varOrder.size() * 2);
    totalLoopFactorList.resize(varOrder.size());
    
    productLoopID.resize(varOrder.size() * 2);
    incViewLoopID.resize(varOrder.size() * 2);
    aggRegLoopID.resize(varOrder.size() * 2);

    aggregateRemapping.resize(newAggregateRegister.size());
    localProductRemapping.resize(localProductList.size());
    viewProductRemapping.resize(viewProductList.size());

    postRemapping.clear();
    postRemapping.resize(varOrder.size() + 1);

    productToVariableMap.resize(varOrder.size()*2);
    productToVariableRegister.resize(varOrder.size()*2);

    aggregateComputation.resize(_qc->numberOfViews());

    newAggregateRemapping.resize(varOrder.size());
    // localProductRemapping.resize(varOrder.size());
    // viewProductRemapping.resize(varOrder.size());
    // TODO: TODO: TODO: TODO: TODO: check if the above is correct 
    
    for (const size_t& viewID : viewGroups[group_id])
    {
        View* view = _qc->getView(viewID);


        size_t numberIncomingViews =
            (view->_origin == view->_destination ? node._numOfNeighbors :
             node._numOfNeighbors - 1);
        
        if (numberIncomingViews !=
            view->_aggregates[0]->_incoming.size() / view->_aggregates[0]->_agg.size())
        {
            ERROR("Why is this?! \n ");
            ERROR(view->_origin << " " << view->_destination << " " <<
                  node._numOfNeighbors << " " <<
                  view->_aggregates[0]->_incoming.size()  << "  " << 
                  view->_aggregates[0]->_agg.size()  << "\n");

            for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
            {
                size_t incCounter = 0;
                for (size_t inc = 0; inc <
                         view->_aggregates[aggNo]->_incoming.size(); ++inc)
                {
                    std::cout << view->_aggregates[aggNo]->_incoming[incCounter].first
                              << " " <<
                        view->_aggregates[aggNo]->_incoming[incCounter].second << " - ";
                    incCounter++;
                }
                std::cout << std::endl;
            }
            exit(1);
        }

        dyn_bitset loopFactors(_qc->numberOfViews()+1);

        // Compute the loops that are required by this view. 
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                if (!varOrderBitset[var])
                {
                    // if var is in relation - use relation 
                    if (node._bag[var])
                    {                                   
                        loopFactors.set(_qc->numberOfViews());
                    }
                    else // else find corresponding view 
                    {
                        for (const size_t& incViewID : incomingViews[viewID])
                        {
                            if (_qc->getView(incViewID)->_fVars[var])
                                loopFactors.set(incViewID);
                        }
                    }
                }
            }
        }

        outViewLoop[viewID] = loopFactors;
        
        // We add loop Factors for this view to the totalLoopFactors and keep
        // track of the id.
        // if (viewLevelRegister[viewID] != varOrder.size())
        // {            
        //     size_t depDepth = varOrder.size() + viewLevelRegister[viewID];
        //     auto loopit = totalLoopFactors[depDepth].find(loopFactors);
        //     if (loopit != totalLoopFactors[depDepth].end())
        //     {
        //         outViewLoopID[viewID] = loopit->second;
        //     }
        //     else
        //     {
        //         size_t loopID = totalLoopFactors[depDepth].size();
        //         outViewLoopID[viewID] = loopID;            
        //         totalLoopFactors[depDepth][loopFactors] = loopID;
        //     }
        // }
        
        for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
        {
            // We use a copy of the actual aggregate
            Aggregate aggregate = *(view->_aggregates[aggNo]);

            std::vector<std::pair<size_t, size_t>>
                localAggReg(aggregate._agg.size(),{varOrder.size(), 0});

            dependentComputation.clear();
            dependentComputation.resize(aggregate._agg.size());

            // computeAggregateRegister(&aggregate,group_id,viewID,aggNo,0,localAggReg);
            registerAggregatesToVariables
                (&aggregate,group_id,viewID,aggNo,0,localAggReg);
        }
    }

    // DINFO("Registered Aggregates to Variables \n"); 
}